

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereOrInsert(WhereOrSet *pSet,Bitmask prereq,LogEst rRun,LogEst nOut)

{
  ushort uVar1;
  WhereOrCost *pWVar2;
  WhereOrCost *pWVar3;
  ushort uVar4;
  WhereOrCost *pWVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = pSet->n;
  uVar6 = (ulong)uVar1;
  pWVar3 = pSet->a;
  pWVar2 = pWVar3;
  uVar4 = uVar1;
  while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
    if ((rRun <= pWVar2->rRun) && ((prereq & ~pWVar2->prereq) == 0)) goto LAB_001617ae;
    if ((pWVar2->rRun <= rRun) && ((pWVar2->prereq & ~prereq) == 0)) goto LAB_001617bf;
    pWVar2 = pWVar2 + 1;
  }
  if (uVar1 < 3) {
    pSet->n = uVar1 + 1;
    pSet->a[uVar1].nOut = nOut;
    pWVar2 = pWVar3 + uVar1;
  }
  else {
    pWVar5 = pSet->a;
    while( true ) {
      pWVar2 = pWVar3;
      pWVar5 = pWVar5 + 1;
      uVar6 = uVar6 - 1;
      if (uVar6 == 0) break;
      pWVar3 = pWVar5;
      if (pWVar2->rRun <= pWVar5->rRun) {
        pWVar3 = pWVar2;
      }
    }
    pWVar3 = pWVar2;
    if (pWVar2->rRun <= rRun) goto LAB_001617bf;
  }
LAB_001617ae:
  pWVar2->prereq = prereq;
  pWVar2->rRun = rRun;
  pWVar3 = pWVar2;
  if (nOut < pWVar2->nOut) {
    pWVar2->nOut = nOut;
  }
LAB_001617bf:
  return (int)pWVar3;
}

Assistant:

static int whereOrInsert(
  WhereOrSet *pSet,      /* The WhereOrSet to be updated */
  Bitmask prereq,        /* Prerequisites of the new entry */
  LogEst rRun,           /* Run-cost of the new entry */
  LogEst nOut            /* Number of outputs for the new entry */
){
  u16 i;
  WhereOrCost *p;
  for(i=pSet->n, p=pSet->a; i>0; i--, p++){
    if( rRun<=p->rRun && (prereq & p->prereq)==prereq ){
      goto whereOrInsert_done;
    }
    if( p->rRun<=rRun && (p->prereq & prereq)==p->prereq ){
      return 0;
    }
  }
  if( pSet->n<N_OR_COST ){
    p = &pSet->a[pSet->n++];
    p->nOut = nOut;
  }else{
    p = pSet->a;
    for(i=1; i<pSet->n; i++){
      if( p->rRun>pSet->a[i].rRun ) p = pSet->a + i;
    }
    if( p->rRun<=rRun ) return 0;
  }
whereOrInsert_done:
  p->prereq = prereq;
  p->rRun = rRun;
  if( p->nOut>nOut ) p->nOut = nOut;
  return 1;
}